

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printRegImmShift(MCInst *MI,SStream *O,ARM_AM_ShiftOpc ShOpc,uint ShImm)

{
  uint uVar1;
  char *s;
  uint ShImm_local;
  ARM_AM_ShiftOpc ShOpc_local;
  SStream *O_local;
  MCInst *MI_local;
  
  if ((ShOpc != ARM_AM_no_shift) && ((ShOpc != ARM_AM_lsl || (ShImm != 0)))) {
    SStream_concat0(O,", ");
    s = ARM_AM_getShiftOpcStr(ShOpc);
    SStream_concat0(O,s);
    if (MI->csh->detail != CS_OPT_OFF) {
      if ((MI->csh->doing_mem & 1U) == 0) {
        *(ARM_AM_ShiftOpc *)
         (MI->flat_insn->detail->groups +
         (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x3a) = ShOpc;
      }
      else {
        *(ARM_AM_ShiftOpc *)
         (MI->flat_insn->detail->groups +
         (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x3a) = ShOpc;
      }
    }
    if (ShOpc != ARM_AM_rrx) {
      SStream_concat0(O," ");
      uVar1 = translateShiftImm(ShImm);
      SStream_concat(O,"#%u",(ulong)uVar1);
      if (MI->csh->detail != CS_OPT_OFF) {
        if ((MI->csh->doing_mem & 1U) == 0) {
          uVar1 = translateShiftImm(ShImm);
          *(uint *)(MI->flat_insn->detail->groups +
                   (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x3e) =
               uVar1;
        }
        else {
          uVar1 = translateShiftImm(ShImm);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x3e) = uVar1;
        }
      }
    }
  }
  return;
}

Assistant:

static void printRegImmShift(MCInst *MI, SStream *O, ARM_AM_ShiftOpc ShOpc, unsigned ShImm)
{
	if (ShOpc == ARM_AM_no_shift || (ShOpc == ARM_AM_lsl && !ShImm))
		return;
	SStream_concat0(O, ", ");

	//assert (!(ShOpc == ARM_AM_ror && !ShImm) && "Cannot have ror #0");
	SStream_concat0(O, ARM_AM_getShiftOpcStr(ShOpc));
	if (MI->csh->detail) {
		if (MI->csh->doing_mem)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.type = (arm_shifter)ShOpc;
		else
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = (arm_shifter)ShOpc;
	}

	if (ShOpc != ARM_AM_rrx) {
		SStream_concat0(O, " ");
		SStream_concat(O, "#%u", translateShiftImm(ShImm));
		if (MI->csh->detail) {
			if (MI->csh->doing_mem)
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.value = translateShiftImm(ShImm);
			else
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = translateShiftImm(ShImm);
		}
	}
}